

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O3

void __thiscall
icu_63::PluralFormat::PluralFormat
          (PluralFormat *this,Locale *loc,PluralRules *rules,UnicodeString *pat,UErrorCode *status)

{
  Format::Format(&this->super_Format);
  (this->super_Format).super_UObject._vptr_UObject = (_func_int **)&PTR__PluralFormat_003b5a60;
  Locale::Locale(&this->locale,loc);
  MessagePattern::MessagePattern(&this->msgPattern,status);
  this->numberFormat = (NumberFormat *)0x0;
  this->offset = 0.0;
  (this->pluralRulesWrapper).super_PluralSelector._vptr_PluralSelector =
       (_func_int **)&PTR__PluralSelectorAdapter_003b5ab8;
  (this->pluralRulesWrapper).pluralRules = (PluralRules *)0x0;
  init(this,(EVP_PKEY_CTX *)rules);
  applyPattern(this,pat,status);
  return;
}

Assistant:

PluralFormat::PluralFormat(const Locale& loc,
                           const PluralRules& rules,
                           const UnicodeString& pat,
                           UErrorCode& status)
        : locale(loc),
          msgPattern(status),
          numberFormat(NULL),
          offset(0) {
    init(&rules, UPLURAL_TYPE_COUNT, status);
    applyPattern(pat, status);
}